

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::_::Delimited<kj::ArrayPtr<kj::String_const>>>
          (String *__return_storage_ptr__,_ *this,Delimited<kj::ArrayPtr<const_kj::String>_> *params
          )

{
  ArrayPtr<const_char> *pAVar1;
  size_t sVar2;
  char *target;
  Delimited<kj::ArrayPtr<const_kj::String>_> local_48;
  
  sVar2 = Delimited<kj::ArrayPtr<const_kj::String>_>::size
                    ((Delimited<kj::ArrayPtr<const_kj::String>_> *)this);
  heapString(__return_storage_ptr__,sVar2);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  local_48.array.ptr = *(String **)this;
  local_48.array.size_ = *(size_t *)(this + 8);
  local_48.delimiter.content.ptr = *(char **)(this + 0x10);
  local_48.delimiter.content.size_ = *(size_t *)(this + 0x18);
  local_48.stringified.ptr = *(ArrayPtr<const_char> **)(this + 0x20);
  local_48.stringified.size_ = *(size_t *)(this + 0x28);
  local_48.stringified.disposer = *(ArrayDisposer **)(this + 0x30);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  Delimited<kj::ArrayPtr<const_kj::String>_>::flattenTo(&local_48,target);
  sVar2 = local_48.stringified.size_;
  pAVar1 = local_48.stringified.ptr;
  if (local_48.stringified.ptr != (ArrayPtr<const_char> *)0x0) {
    local_48.stringified.ptr = (ArrayPtr<const_char> *)0x0;
    local_48.stringified.size_ = 0;
    (**(local_48.stringified.disposer)->_vptr_ArrayDisposer)
              (local_48.stringified.disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}